

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SequentialStmtBlock *stmt)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  *var_str;
  undefined1 *puVar1;
  long *plVar2;
  pointer pEVar3;
  undefined1 this_00 [8];
  pointer pbVar4;
  int iVar5;
  ostream *poVar6;
  ostream *poVar7;
  string *in_R8;
  ulong uVar8;
  pointer this_01;
  string_view sVar9;
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitive_list;
  undefined1 local_78 [8];
  string sensitive_list_str;
  long lStack_50;
  code *local_48;
  code *pcStack_40;
  char local_31;
  
  if ((stmt->super_StmtBlock).super_Stmt.super_IRNode.comment._M_string_length != 0) {
    sVar9 = indent(this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar9._M_str,
                        sVar9._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"// ",3);
    strip_newline((string *)local_78,&(stmt->super_StmtBlock).super_Stmt.super_IRNode.comment);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_78,(long)sensitive_list_str._M_dataplus._M_p);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    sensitive_list_str.field_2._M_local_buf[8] = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,sensitive_list_str.field_2._M_local_buf + 8,1);
    if (local_78 != (undefined1  [8])&sensitive_list_str._M_string_length) {
      operator_delete((void *)local_78,sensitive_list_str._M_string_length + 1);
    }
  }
  if (this->generator_->debug == true) {
    (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  auStack_98 = (undefined1  [8])0x0;
  sensitive_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sensitive_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (stmt->conditions_).
            super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar3 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sensitive_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (this_01 != pEVar3) {
    var_str = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
               *)((long)&sensitive_list_str.field_2 + 8);
    do {
      lStack_50 = 0;
      sensitive_list_str.field_2._8_8_ =
           sensitive_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcStack_40 = std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:545:21)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:545:21)>
                 ::_M_manager;
      EventControl::to_string((string *)local_78,this_01,var_str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_98,
                 (string *)local_78);
      if (local_78 != (undefined1  [8])&sensitive_list_str._M_string_length) {
        operator_delete((void *)local_78,sensitive_list_str._M_string_length + 1);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(var_str,var_str,3);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pEVar3);
  }
  pbVar4 = sensitive_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_98;
  sensitive_list_str.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&sensitive_list_str.field_2 + 8),", ","");
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)local_78,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&sensitive_list_str.field_2 + 8),in_R8);
  pbVar4 = sensitive_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((code **)sensitive_list_str.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)sensitive_list_str.field_2._8_8_,(ulong)(local_48 + 1));
  }
  plVar2 = (long *)((long)&pbVar4[0xb].field_2 + 8);
  *plVar2 = *plVar2 + 1;
  poVar6 = (ostream *)((long)&pbVar4[7].field_2 + 8);
  sensitive_list_str.field_2._M_local_buf[8] = 10;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,sensitive_list_str.field_2._M_local_buf + 8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"always_ff @(",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_78,(long)sensitive_list_str._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") begin",7);
  block_label_abi_cxx11_
            ((string *)((long)&sensitive_list_str.field_2 + 8),(SystemVerilogCodeGen *)pbVar4,
             &stmt->super_StmtBlock);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)sensitive_list_str.field_2._8_8_,lStack_50);
  plVar2 = (long *)((long)&pbVar4[0xb].field_2 + 8);
  *plVar2 = *plVar2 + 1;
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_31,1);
  if ((code **)sensitive_list_str.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)sensitive_list_str.field_2._8_8_,(ulong)(local_48 + 1));
  }
  (pbVar4->field_2)._M_allocated_capacity = (pbVar4->field_2)._M_allocated_capacity + 1;
  if ((stmt->super_StmtBlock).stmts_.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (stmt->super_StmtBlock).stmts_.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      iVar5 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar8);
      (**(code **)(pbVar4->_M_dataplus)._M_p)(pbVar4,iVar5);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(stmt->super_StmtBlock).stmts_.
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  (pbVar4->field_2)._M_allocated_capacity = (pbVar4->field_2)._M_allocated_capacity - 1;
  sVar9 = indent((SystemVerilogCodeGen *)pbVar4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,sVar9._M_str,sVar9._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
  block_label_abi_cxx11_
            ((string *)((long)&sensitive_list_str.field_2 + 8),(SystemVerilogCodeGen *)pbVar4,
             &stmt->super_StmtBlock);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)sensitive_list_str.field_2._8_8_,lStack_50);
  plVar2 = (long *)((long)&pbVar4[0xb].field_2 + 8);
  *plVar2 = *plVar2 + 1;
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
  if ((code **)sensitive_list_str.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)sensitive_list_str.field_2._8_8_,(ulong)(local_48 + 1));
  }
  if (local_78 != (undefined1  [8])&sensitive_list_str._M_string_length) {
    operator_delete((void *)local_78,sensitive_list_str._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_98);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SequentialStmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    // produce the sensitive list
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    std::vector<std::string> sensitive_list;
    for (const auto& event_control : stmt->get_event_controls()) {
        auto func = [this](const Var* var) { return stream_.var_str(var); };
        sensitive_list.emplace_back(event_control.to_string(func));
    }
    std::string sensitive_list_str =
        string::join(sensitive_list.begin(), sensitive_list.end(), ", ");
    stream_ << stream_.endl() << "always_ff @(" << sensitive_list_str << ") begin"
            << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}